

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase *
CreateBinaryOp(ExpressionEvalContext *ctx,SynBase *source,ExprBase *lhs,ExprBase *unevaluatedRhs,
              SynBinaryOpType op)

{
  TypeBase *pTVar1;
  Allocator *pAVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *pEVar7;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  ExpressionContext *pEVar8;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  TypeBase *pTVar9;
  undefined4 extraout_var_53;
  int iVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  _func_int **pp_Var15;
  char *pcVar16;
  uint uVar17;
  ExprRationalLiteral *expr;
  _func_int **pp_Var18;
  _func_int **pp_Var19;
  bool bVar20;
  bool bVar21;
  double lhsValue;
  double rhsValue;
  _func_int **local_48;
  SynBase *local_40;
  double local_38;
  undefined4 extraout_var_05;
  
  pTVar9 = lhs->type;
  if (((pTVar9 != (TypeBase *)0x0) && (pTVar9->typeID == 0)) ||
     ((pTVar1 = unevaluatedRhs->type, pTVar1 != (TypeBase *)0x0 && (pTVar1->typeID == 0)))) {
    pcVar16 = "ERROR: encountered an error node";
    goto LAB_00135498;
  }
  if (pTVar9 != pTVar1) {
    __assert_fail("lhs->type == unevaluatedRhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,599,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  bVar4 = ExpressionContext::IsIntegerType(ctx->ctx,pTVar9);
  if (((bVar4) || ((lhs->type != (TypeBase *)0x0 && (lhs->type->typeID == 0x19)))) &&
     ((bVar4 = ExpressionContext::IsIntegerType(ctx->ctx,unevaluatedRhs->type), bVar4 ||
      ((unevaluatedRhs->type != (TypeBase *)0x0 && (unevaluatedRhs->type->typeID == 0x19)))))) {
    local_48 = (_func_int **)0x0;
    if (op == SYN_BINARY_OP_LOGICAL_OR) {
      bVar4 = TryTakeLong(lhs,(longlong *)&local_48);
      if (!bVar4) {
        return (ExprBase *)0x0;
      }
      if (local_48 == (_func_int **)0x1) {
        pAVar2 = ctx->ctx->allocator;
        iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        pEVar6->typeID = 3;
        pEVar6->source = source;
        pEVar6->type = pTVar9;
        pEVar6->next = (ExprBase *)0x0;
        *(undefined2 *)&pEVar6->listed = 0x100;
LAB_00135405:
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
        return pEVar6;
      }
      pEVar6 = Evaluate(ctx,unevaluatedRhs);
      if (pEVar6 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      switch(pEVar6->typeID) {
      case 3:
switchD_001350fb_caseD_3:
        pp_Var15 = (_func_int **)(ulong)(byte)pEVar6->field_0x29;
        break;
      case 4:
switchD_001350fb_caseD_4:
        pp_Var15 = (_func_int **)(long)(char)pEVar6->field_0x29;
        break;
      default:
        return (ExprBase *)0x0;
      case 6:
switchD_001350fb_caseD_6:
        pp_Var15 = pEVar6[1]._vptr_ExprBase;
        break;
      case 7:
switchD_001350fb_caseD_7:
        pp_Var15 = (_func_int **)(long)(double)pEVar6[1]._vptr_ExprBase;
      }
      pAVar2 = ctx->ctx->allocator;
      iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_04,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar4 = pp_Var15 == (_func_int **)0x0;
      goto LAB_001354ef;
    }
    if (op == SYN_BINARY_OP_LOGICAL_AND) {
      bVar4 = TryTakeLong(lhs,(longlong *)&local_48);
      if (!bVar4) {
        return (ExprBase *)0x0;
      }
      if (local_48 == (_func_int **)0x0) {
        pAVar2 = ctx->ctx->allocator;
        iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        pEVar6->typeID = 3;
        pEVar6->source = source;
        pEVar6->type = pTVar9;
        pEVar6->next = (ExprBase *)0x0;
        *(undefined2 *)&pEVar6->listed = 0;
        goto LAB_00135405;
      }
      pEVar6 = Evaluate(ctx,unevaluatedRhs);
      if (pEVar6 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      pEVar7 = (ExprBase *)0x0;
      switch(pEVar6->typeID) {
      case 3:
        goto switchD_001350fb_caseD_3;
      case 4:
        goto switchD_001350fb_caseD_4;
      default:
        goto switchD_001350fb_caseD_5;
      case 6:
        goto switchD_001350fb_caseD_6;
      case 7:
        goto switchD_001350fb_caseD_7;
      }
    }
    pEVar6 = Evaluate(ctx,unevaluatedRhs);
    if (pEVar6 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    local_40 = source;
    if (lhs->type != pEVar6->type) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x28a,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    }
    pEVar8 = ctx->ctx;
    pTVar9 = (&pEVar8->typeInt)[lhs->type == pEVar8->typeLong];
    bVar4 = TryTakeLong(lhs,(longlong *)&local_48);
    pp_Var15 = local_48;
    if (!bVar4) goto switchD_0013531a_caseD_5;
    switch(pEVar6->typeID) {
    case 3:
      pp_Var18 = (_func_int **)(ulong)(byte)pEVar6->field_0x29;
      break;
    case 4:
      pp_Var18 = (_func_int **)(long)(char)pEVar6->field_0x29;
      break;
    default:
      goto switchD_0013531a_caseD_5;
    case 6:
      pp_Var18 = pEVar6[1]._vptr_ExprBase;
      break;
    case 7:
      pp_Var18 = (_func_int **)(long)(double)pEVar6[1]._vptr_ExprBase;
    }
    uVar17 = (uint)pp_Var18;
    bVar3 = (byte)pp_Var18;
    if (pTVar9 == pEVar8->typeInt) {
      if (0x13 < op - SYN_BINARY_OP_ADD) {
switchD_00135598_caseD_12:
        __assert_fail("!\"unexpected type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x2de,
                      "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                     );
      }
      uVar13 = (uint)local_48;
      switch(op) {
      case SYN_BINARY_OP_ADD:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_06,iVar5);
        pTVar9 = lhs->type;
        uVar13 = uVar13 + uVar17;
        break;
      case SYN_BINARY_OP_SUB:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_51,iVar5);
        pTVar9 = lhs->type;
        uVar13 = uVar13 - uVar17;
        break;
      case SYN_BINARY_OP_MUL:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_48,iVar5);
        pTVar9 = lhs->type;
        local_48 = (_func_int **)(long)(int)(uVar17 * uVar13);
        goto LAB_00136066;
      case SYN_BINARY_OP_DIV:
        if (uVar17 != 0) {
          iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_50,iVar5);
          pTVar9 = lhs->type;
          local_48 = (_func_int **)
                     (long)(int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                       (ulong)pp_Var15 & 0xffffffff) / (long)(int)uVar17);
LAB_00135fdf:
          pEVar6->typeID = 6;
          pEVar6->source = local_40;
          pEVar6->type = pTVar9;
          pEVar6->next = (ExprBase *)0x0;
          pEVar6->listed = false;
          pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
          pEVar6[1]._vptr_ExprBase = local_48;
          return pEVar6;
        }
        goto LAB_00136014;
      case SYN_BINARY_OP_MOD:
        if (uVar17 != 0) {
          iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_46,iVar5);
          pTVar9 = lhs->type;
          local_48 = (_func_int **)
                     (long)(int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                       (ulong)pp_Var15 & 0xffffffff) % (long)(int)uVar17);
          goto LAB_00135fdf;
        }
        goto LAB_00135ef3;
      case SYN_BINARY_OP_POW:
        if (-1 < (int)uVar17) {
          if (uVar17 == 0) {
            pp_Var15 = (_func_int **)0x1;
          }
          else {
            iVar5 = 1;
            do {
              iVar14 = (int)pp_Var15;
              iVar10 = 1;
              if (((ulong)pp_Var18 & 1) != 0) {
                iVar10 = iVar14;
              }
              iVar5 = iVar5 * iVar10;
              uVar17 = (uint)pp_Var18;
              pp_Var15 = (_func_int **)(ulong)(uint)(iVar14 * iVar14);
              pp_Var18 = (_func_int **)(ulong)(uVar17 >> 1);
            } while (1 < (uVar17 & 0xfffffffe));
            pp_Var15 = (_func_int **)(long)iVar5;
          }
          iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_53,iVar5);
          pTVar9 = lhs->type;
          pEVar6->typeID = 6;
          pEVar6->source = local_40;
          pEVar6->type = pTVar9;
          pEVar6->next = (ExprBase *)0x0;
          pEVar6->listed = false;
          pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
          pEVar6[1]._vptr_ExprBase = pp_Var15;
          return pEVar6;
        }
        goto LAB_00135f59;
      case SYN_BINARY_OP_SHL:
        if ((int)uVar17 < 0) goto LAB_0013609b;
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_52,iVar5);
        pTVar9 = lhs->type;
        uVar13 = uVar13 << (bVar3 & 0x1f);
        break;
      case SYN_BINARY_OP_SHR:
        if ((int)uVar17 < 0) goto LAB_0013609b;
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_49,iVar5);
        pTVar9 = lhs->type;
        uVar13 = (int)uVar13 >> (bVar3 & 0x1f);
        break;
      case SYN_BINARY_OP_LESS:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_41,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar20 = SBORROW4(uVar13,uVar17);
        bVar4 = (int)(uVar13 - uVar17) < 0;
        goto LAB_00135db3;
      case SYN_BINARY_OP_LESS_EQUAL:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_38,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar21 = SBORROW4(uVar13,uVar17);
        bVar20 = (int)(uVar13 - uVar17) < 0;
        bVar4 = uVar13 == uVar17;
        goto LAB_00135ccb;
      case SYN_BINARY_OP_GREATER:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_40,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar21 = SBORROW4(uVar13,uVar17);
        bVar20 = (int)(uVar13 - uVar17) < 0;
        bVar4 = uVar13 == uVar17;
        goto LAB_00135d5b;
      case SYN_BINARY_OP_GREATER_EQUAL:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_37,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar20 = SBORROW4(uVar13,uVar17);
        bVar4 = (int)(uVar13 - uVar17) < 0;
        goto LAB_00135c73;
      case SYN_BINARY_OP_EQUAL:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_39,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar4 = uVar13 == uVar17;
        goto LAB_00135d23;
      case SYN_BINARY_OP_NOT_EQUAL:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_42,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar4 = uVar13 == uVar17;
        goto LAB_00135e0b;
      case SYN_BINARY_OP_BIT_AND:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_44,iVar5);
        pTVar9 = lhs->type;
        uVar13 = uVar13 & uVar17;
        break;
      case SYN_BINARY_OP_BIT_OR:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_47,iVar5);
        pTVar9 = lhs->type;
        uVar13 = uVar13 | uVar17;
        break;
      case SYN_BINARY_OP_BIT_XOR:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_45,iVar5);
        pTVar9 = lhs->type;
        uVar13 = uVar13 ^ uVar17;
        break;
      default:
        goto switchD_00135598_caseD_12;
      case SYN_BINARY_OP_LOGICAL_XOR:
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_43,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar4 = uVar13 != 0;
        bVar20 = uVar17 == 0;
        goto LAB_00135e48;
      }
      local_48 = (_func_int **)(long)(int)uVar13;
LAB_00136066:
      pEVar6->typeID = 6;
      pEVar6->source = local_40;
      pEVar6->type = pTVar9;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
      pEVar6[1]._vptr_ExprBase = local_48;
      return pEVar6;
    }
    switch(op) {
    case SYN_BINARY_OP_ADD:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_05,iVar5);
      pTVar9 = lhs->type;
      pp_Var18 = (_func_int **)((long)pp_Var18 + (long)local_48);
      break;
    case SYN_BINARY_OP_SUB:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_35,iVar5);
      pTVar9 = lhs->type;
      local_48 = (_func_int **)((long)local_48 - (long)pp_Var18);
      goto LAB_00136066;
    case SYN_BINARY_OP_MUL:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_32,iVar5);
      pTVar9 = lhs->type;
      pp_Var18 = (_func_int **)((long)pp_Var18 * (long)local_48);
      break;
    case SYN_BINARY_OP_DIV:
      if (pp_Var18 != (_func_int **)0x0) {
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_34,iVar5);
        pTVar9 = lhs->type;
        local_48 = (_func_int **)((long)local_48 / (long)pp_Var18);
        goto LAB_00135fdf;
      }
LAB_00136014:
      pcVar16 = "ERROR: division by zero during constant folding";
      goto LAB_001360a2;
    case SYN_BINARY_OP_MOD:
      if (pp_Var18 != (_func_int **)0x0) {
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_29,iVar5);
        pTVar9 = lhs->type;
        local_48 = (_func_int **)((long)local_48 % (long)pp_Var18);
        pEVar6->typeID = 6;
        pEVar6->source = local_40;
        pEVar6->type = pTVar9;
        goto LAB_00135c31;
      }
LAB_00135ef3:
      pcVar16 = "ERROR: modulus division by zero during constant folding";
      goto LAB_001360a2;
    case SYN_BINARY_OP_POW:
      if (-1 < (long)pp_Var18) {
        pp_Var19 = (_func_int **)0x1;
        if (pp_Var18 != (_func_int **)0x0) {
          do {
            pp_Var11 = (_func_int **)0x1;
            if (((ulong)pp_Var18 & 1) != 0) {
              pp_Var11 = pp_Var15;
            }
            pp_Var19 = (_func_int **)((long)pp_Var19 * (long)pp_Var11);
            uVar12 = (ulong)pp_Var18 & 0xfffffffffffffffe;
            pp_Var18 = (_func_int **)((ulong)pp_Var18 >> 1);
            pp_Var15 = (_func_int **)((long)pp_Var15 * (long)pp_Var15);
          } while (1 < uVar12);
        }
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_31,iVar5);
        pTVar9 = lhs->type;
        pEVar6->typeID = 6;
        pEVar6->source = local_40;
        pEVar6->type = pTVar9;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
        pEVar6[1]._vptr_ExprBase = pp_Var19;
        return pEVar6;
      }
LAB_00135f59:
      pcVar16 = "ERROR: negative power on integer number in exponentiation during constant folding";
      goto LAB_001360a2;
    case SYN_BINARY_OP_SHL:
      if (-1 < (long)pp_Var18) {
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_36,iVar5);
        pTVar9 = lhs->type;
        local_48 = (_func_int **)((long)local_48 << (bVar3 & 0x3f));
LAB_00135c1c:
        pEVar6->typeID = 6;
        pEVar6->source = local_40;
        pEVar6->type = pTVar9;
LAB_00135c31:
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
        pEVar6[1]._vptr_ExprBase = local_48;
        return pEVar6;
      }
      goto LAB_0013609b;
    case SYN_BINARY_OP_SHR:
      if (-1 < (long)pp_Var18) {
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_33,iVar5);
        pTVar9 = lhs->type;
        local_48 = (_func_int **)((long)local_48 >> (bVar3 & 0x3f));
        goto LAB_00135c1c;
      }
LAB_0013609b:
      pcVar16 = "ERROR: negative shift value";
LAB_001360a2:
      ReportCritical(ctx,pcVar16);
      return (ExprBase *)0x0;
    case SYN_BINARY_OP_LESS:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_24,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar20 = SBORROW8((long)local_48,(long)pp_Var18);
      bVar4 = (long)local_48 - (long)pp_Var18 < 0;
LAB_00135db3:
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
      pEVar6->type = pTVar9;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
      pEVar6->field_0x29 = bVar20 != bVar4;
      return pEVar6;
    case SYN_BINARY_OP_LESS_EQUAL:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_21,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar21 = SBORROW8((long)local_48,(long)pp_Var18);
      bVar20 = (long)local_48 - (long)pp_Var18 < 0;
      bVar4 = local_48 == pp_Var18;
LAB_00135ccb:
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
      pEVar6->type = pTVar9;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
      pEVar6->field_0x29 = bVar4 || bVar21 != bVar20;
      return pEVar6;
    case SYN_BINARY_OP_GREATER:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_23,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar21 = SBORROW8((long)local_48,(long)pp_Var18);
      bVar20 = (long)local_48 - (long)pp_Var18 < 0;
      bVar4 = local_48 == pp_Var18;
LAB_00135d5b:
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
      pEVar6->type = pTVar9;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
      pEVar6->field_0x29 = !bVar4 && bVar21 == bVar20;
      return pEVar6;
    case SYN_BINARY_OP_GREATER_EQUAL:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_20,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar20 = SBORROW8((long)local_48,(long)pp_Var18);
      bVar4 = (long)local_48 - (long)pp_Var18 < 0;
LAB_00135c73:
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
      pEVar6->type = pTVar9;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
      pEVar6->field_0x29 = bVar20 == bVar4;
      return pEVar6;
    case SYN_BINARY_OP_EQUAL:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_22,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar4 = local_48 == pp_Var18;
LAB_00135d23:
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
LAB_0013546f:
      pEVar6->type = pTVar9;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
      pEVar6->field_0x29 = bVar4;
      return pEVar6;
    case SYN_BINARY_OP_NOT_EQUAL:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_25,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar4 = local_48 == pp_Var18;
LAB_00135e0b:
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
      goto LAB_001354fb;
    case SYN_BINARY_OP_BIT_AND:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_27,iVar5);
      pTVar9 = lhs->type;
      pp_Var18 = (_func_int **)((ulong)pp_Var18 & (ulong)local_48);
      break;
    case SYN_BINARY_OP_BIT_OR:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_30,iVar5);
      pTVar9 = lhs->type;
      pp_Var18 = (_func_int **)((ulong)pp_Var18 | (ulong)local_48);
      break;
    case SYN_BINARY_OP_BIT_XOR:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_28,iVar5);
      pTVar9 = lhs->type;
      pp_Var18 = (_func_int **)((ulong)pp_Var18 ^ (ulong)local_48);
      break;
    default:
      __assert_fail("!\"unexpected type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x32a,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    case SYN_BINARY_OP_LOGICAL_XOR:
      iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_26,iVar5);
      pTVar9 = ctx->ctx->typeBool;
      bVar4 = local_48 != (_func_int **)0x0;
      bVar20 = pp_Var18 == (_func_int **)0x0;
LAB_00135e48:
      bVar4 = (bool)(!bVar20 ^ bVar4);
      pEVar6->typeID = 3;
      pEVar6->source = local_40;
      goto LAB_00135e5e;
    }
    pEVar7->typeID = 6;
    pEVar7->source = local_40;
    pEVar7->type = pTVar9;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
    pEVar7[1]._vptr_ExprBase = pp_Var18;
switchD_001350fb_caseD_5:
    return pEVar7;
  }
  pEVar6 = Evaluate(ctx,unevaluatedRhs);
  if (pEVar6 == (ExprBase *)0x0) {
    return (ExprBase *)0x0;
  }
  bVar4 = ExpressionContext::IsFloatingPointType(ctx->ctx,lhs->type);
  if ((!bVar4) || (bVar4 = ExpressionContext::IsFloatingPointType(ctx->ctx,pEVar6->type), !bVar4)) {
    pTVar9 = lhs->type;
    pEVar8 = ctx->ctx;
    if ((pTVar9 != pEVar8->typeTypeID) || (pEVar6->type != pTVar9)) {
      if ((((pTVar9 != (TypeBase *)0x0) && (pTVar9->typeID == 0x12)) &&
          (pTVar1 = pEVar6->type, pTVar1 != (TypeBase *)0x0)) && (pTVar1->typeID == 0x12)) {
        if (pTVar9 != pTVar1) {
          __assert_fail("lhs->type == rhs->type",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x371,
                        "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                       );
        }
        if (lhs->typeID == 9) {
          pp_Var15 = (_func_int **)0x0;
        }
        else {
          if (lhs->typeID != 0xc) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x37a,
                          "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                         );
          }
          pp_Var15 = lhs[1]._vptr_ExprBase;
        }
        if (pEVar6->typeID == 9) {
          pp_Var18 = (_func_int **)0x0;
        }
        else {
          if (pEVar6->typeID != 0xc) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,899,
                          "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                         );
          }
          pp_Var18 = pEVar6[1]._vptr_ExprBase;
        }
        if (op == SYN_BINARY_OP_NOT_EQUAL) {
          iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_07,iVar5);
          pTVar9 = ctx->ctx->typeBool;
          bVar4 = pp_Var15 == pp_Var18;
          goto LAB_001354ef;
        }
        if (op == SYN_BINARY_OP_EQUAL) {
          iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_03,iVar5);
          pTVar9 = ctx->ctx->typeBool;
          bVar4 = pp_Var15 == pp_Var18;
          goto LAB_00135463;
        }
      }
switchD_0013531a_caseD_5:
      pcVar16 = "ERROR: failed to eval binary op";
LAB_00135498:
      Report(ctx,pcVar16);
      return (ExprBase *)0x0;
    }
    if ((lhs->typeID != 8) || (pEVar6->typeID != 8)) goto switchD_0013531a_caseD_5;
    pp_Var15 = lhs[1]._vptr_ExprBase;
    pp_Var18 = pEVar6[1]._vptr_ExprBase;
    if (op != SYN_BINARY_OP_NOT_EQUAL) {
      if (op == SYN_BINARY_OP_EQUAL) {
        iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
        pTVar9 = ctx->ctx->typeBool;
        bVar4 = pp_Var15 == pp_Var18;
LAB_00135463:
        pEVar6->typeID = 3;
        pEVar6->source = source;
        goto LAB_0013546f;
      }
      goto switchD_0013531a_caseD_5;
    }
    iVar5 = (*pEVar8->allocator->_vptr_Allocator[2])(pEVar8->allocator,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_08,iVar5);
    pTVar9 = ctx->ctx->typeBool;
    bVar4 = pp_Var15 == pp_Var18;
LAB_001354ef:
    pEVar6->typeID = 3;
    pEVar6->source = source;
LAB_001354fb:
    pEVar6->type = pTVar9;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
    pEVar6->field_0x29 = !bVar4;
    return pEVar6;
  }
  if (lhs->type != pEVar6->type) {
    __assert_fail("lhs->type == rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x33a,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  local_48 = (_func_int **)0x0;
  local_38 = 0.0;
  bVar4 = TryTakeDouble(lhs,(double *)&local_48);
  if ((!bVar4) || (bVar4 = TryTakeDouble(pEVar6,&local_38), !bVar4)) goto switchD_0013531a_caseD_5;
  switch(op) {
  case SYN_BINARY_OP_ADD:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pTVar9 = lhs->type;
    local_48 = (_func_int **)((double)local_48 + local_38);
    break;
  case SYN_BINARY_OP_SUB:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_14,iVar5);
    pTVar9 = lhs->type;
    local_48 = (_func_int **)((double)local_48 - local_38);
    break;
  case SYN_BINARY_OP_MUL:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_16,iVar5);
    pTVar9 = lhs->type;
    local_48 = (_func_int **)((double)local_48 * local_38);
    break;
  case SYN_BINARY_OP_DIV:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_18,iVar5);
    pTVar9 = lhs->type;
    local_48 = (_func_int **)((double)local_48 / local_38);
    break;
  case SYN_BINARY_OP_MOD:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_13,iVar5);
    pTVar9 = lhs->type;
    local_48 = (_func_int **)fmod((double)local_48,local_38);
    goto LAB_00135763;
  case SYN_BINARY_OP_POW:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_15,iVar5);
    pTVar9 = lhs->type;
    local_48 = (_func_int **)pow((double)local_48,local_38);
LAB_00135763:
    pEVar6->typeID = 7;
    pEVar6->source = source;
    pEVar6->type = pTVar9;
    goto LAB_0013583b;
  default:
    __assert_fail("!\"unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x35c,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  case SYN_BINARY_OP_LESS:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_19,iVar5);
    pEVar8 = ctx->ctx;
    bVar4 = local_38 == (double)local_48;
    bVar20 = local_38 < (double)local_48;
    goto LAB_00135883;
  case SYN_BINARY_OP_LESS_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_17,iVar5);
    bVar4 = local_38 < (double)local_48;
    goto LAB_001357c8;
  case SYN_BINARY_OP_GREATER:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_12,iVar5);
    pEVar8 = ctx->ctx;
    bVar4 = (double)local_48 == local_38;
    bVar20 = (double)local_48 < local_38;
LAB_00135883:
    pTVar9 = pEVar8->typeBool;
    pEVar6->typeID = 3;
    pEVar6->source = source;
    pEVar6->type = pTVar9;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
    pEVar6->field_0x29 = !bVar20 && !bVar4;
    return pEVar6;
  case SYN_BINARY_OP_GREATER_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_10,iVar5);
    bVar4 = (double)local_48 < local_38;
LAB_001357c8:
    pTVar9 = ctx->ctx->typeBool;
    pEVar6->typeID = 3;
    pEVar6->source = source;
    pEVar6->type = pTVar9;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
    pEVar6->field_0x29 = !bVar4;
    return pEVar6;
  case SYN_BINARY_OP_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_11,iVar5);
    bVar4 = (double)local_48 == local_38;
    pTVar9 = ctx->ctx->typeBool;
    goto LAB_0013569e;
  case SYN_BINARY_OP_NOT_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_09,iVar5);
    bVar4 = (double)local_48 != local_38;
    pTVar9 = ctx->ctx->typeBool;
LAB_0013569e:
    pEVar6->typeID = 3;
    pEVar6->source = source;
LAB_00135e5e:
    pEVar6->type = pTVar9;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234a0;
    pEVar6->field_0x29 = bVar4;
    return pEVar6;
  }
  pEVar6->typeID = 7;
  pEVar6->source = source;
  pEVar6->type = pTVar9;
LAB_0013583b:
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223548;
  pEVar6[1]._vptr_ExprBase = local_48;
  return pEVar6;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionEvalContext &ctx, SynBase *source, ExprBase *lhs, ExprBase *unevaluatedRhs, SynBinaryOpType op)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(unevaluatedRhs->type))
		return Report(ctx, "ERROR: encountered an error node");

	assert(lhs->type == unevaluatedRhs->type);

	if((ctx.ctx.IsIntegerType(lhs->type) || isType<TypeEnum>(lhs->type)) && (ctx.ctx.IsIntegerType(unevaluatedRhs->type) || isType<TypeEnum>(unevaluatedRhs->type)))
	{
		long long lhsValue = 0;
		long long rhsValue = 0;

		// Short-circuit behaviour
		if(op == SYN_BINARY_OP_LOGICAL_AND)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 0)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, false);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		if(op == SYN_BINARY_OP_LOGICAL_OR)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 1)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, true);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

		if(!rhs)
			return NULL;

		assert(lhs->type == rhs->type);

		TypeBase *resultType = ctx.ctx.typeInt;

		if(lhs->type == ctx.ctx.typeLong || rhs->type == ctx.ctx.typeLong)
			resultType = ctx.ctx.typeLong;

		if(TryTakeLong(lhs, lhsValue) && TryTakeLong(rhs, rhsValue))
		{
			if(resultType == ctx.ctx.typeInt)
			{
				int lhsValueInt = int(lhsValue);
				int rhsValueInt = int(rhsValue);

				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt + rhsValueInt);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt - rhsValueInt);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, int(lhsValueInt * rhsValueInt));
				case SYN_BINARY_OP_DIV:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt / rhsValueInt);
				case SYN_BINARY_OP_MOD:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt % rhsValueInt);
				case SYN_BINARY_OP_POW:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					int result, power;

					result = 1;
					power = rhsValueInt;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValueInt;
							power--;
						}
						lhsValueInt *= lhsValueInt;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt << rhsValueInt);
				case SYN_BINARY_OP_SHR:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt >> rhsValueInt);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt < rhsValueInt);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt <= rhsValueInt);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt > rhsValueInt);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt >= rhsValueInt);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt == rhsValueInt);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt != rhsValueInt);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt & rhsValueInt);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt | rhsValueInt);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt ^ rhsValueInt);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValueInt != !!rhsValueInt);
				default:
					assert(!"unexpected type");
					break;
				}
			}
			else
			{
				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue + rhsValue);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue - rhsValue);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue * rhsValue);
				case SYN_BINARY_OP_DIV:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue / rhsValue);
				case SYN_BINARY_OP_MOD:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue % rhsValue);
				case SYN_BINARY_OP_POW:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					long long result, power;

					result = 1;
					power = rhsValue;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValue;
							power--;
						}
						lhsValue *= lhsValue;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue << rhsValue);
				case SYN_BINARY_OP_SHR:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue >> rhsValue);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue & rhsValue);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue | rhsValue);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue ^ rhsValue);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValue != !!rhsValue);
				default:
					assert(!"unexpected type");
					break;
				}
			}
		}

		return Report(ctx, "ERROR: failed to eval binary op");
	}

	ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

	if(!rhs)
		return NULL;

	if(ctx.ctx.IsFloatingPointType(lhs->type) && ctx.ctx.IsFloatingPointType(rhs->type))
	{
		assert(lhs->type == rhs->type);

		double lhsValue = 0;
		double rhsValue = 0;

		if(TryTakeDouble(lhs, lhsValue) && TryTakeDouble(rhs, rhsValue))
		{
			switch(op)
			{
			case SYN_BINARY_OP_ADD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue + rhsValue);
			case SYN_BINARY_OP_SUB:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue - rhsValue);
			case SYN_BINARY_OP_MUL:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue * rhsValue);
			case SYN_BINARY_OP_DIV:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue / rhsValue);
			case SYN_BINARY_OP_MOD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, fmod(lhsValue, rhsValue));
			case SYN_BINARY_OP_POW:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, pow(lhsValue, rhsValue));
			case SYN_BINARY_OP_LESS:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
			case SYN_BINARY_OP_LESS_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
			case SYN_BINARY_OP_GREATER:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
			case SYN_BINARY_OP_GREATER_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
			case SYN_BINARY_OP_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
			case SYN_BINARY_OP_NOT_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
			default:
				assert(!"unexpected type");
				break;
			}
		}
	}
	else if(lhs->type == ctx.ctx.typeTypeID && rhs->type == ctx.ctx.typeTypeID)
	{
		TypeBase *lhsValue = NULL;
		TypeBase *rhsValue = NULL;

		if(TryTakeTypeId(lhs, lhsValue) && TryTakeTypeId(rhs, rhsValue))
		{
			if(op == SYN_BINARY_OP_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);

			if(op == SYN_BINARY_OP_NOT_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
		}
	}
	else if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
	{
		assert(lhs->type == rhs->type);

		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(lhs))
			lPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(lhs))
			lPtr = value->ptr;
		else
			assert(!"unknown type");

		void *rPtr = NULL;

		if(isType<ExprNullptrLiteral>(rhs))
			rPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(rhs))
			rPtr = value->ptr;
		else
			assert(!"unknown type");

		if(op == SYN_BINARY_OP_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr == rPtr);

		if(op == SYN_BINARY_OP_NOT_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr != rPtr);
	}

	return Report(ctx, "ERROR: failed to eval binary op");
}